

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint __thiscall llvm::APInt::countPopulationSlowCase(APInt *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((ulong)this->BitWidth != 0) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = (this->U).pVal[uVar2] - ((this->U).pVal[uVar2] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar1 = uVar1 + (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
      ;
      uVar2 = uVar2 + 1;
    } while ((ulong)this->BitWidth + 0x3f >> 6 != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned APInt::countPopulationSlowCase() const {
  unsigned Count = 0;
  for (unsigned i = 0; i < getNumWords(); ++i)
    Count += llvm::countPopulation(U.pVal[i]);
  return Count;
}